

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQFunctionStateJAOHInterface.h
# Opt level: O2

double __thiscall
FactoredQFunctionStateJAOHInterface::GetLocalQValue
          (FactoredQFunctionStateJAOHInterface *this,Index e,Index stage,Index sfSC_sI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *aoHistIs_e,Index jaI_e)

{
  E *this_00;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  this_00 = (E *)__cxa_allocate_exception
                           (0x28,CONCAT44(in_register_00000034,e),
                            CONCAT44(in_register_00000014,stage));
  E::E(this_00,
       "FactoredQFunctionStateJAOHInterface::  double GetLocalQValue(            Index e,             Index stage,            Index sfSC_sI,            const std::vector<Index>& aoHistIs_e,             Index jaI_e)             should be overridden!"
      );
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

virtual double GetLocalQValue(
            Index e, 
            Index stage,
            Index sfSC_sI,  
            const std::vector<Index>& aoHistIs_e, 
            Index jaI_e //joint group action index
    ) const 
    {
        throw E("FactoredQFunctionStateJAOHInterface::  double GetLocalQValue(\
            Index e, \
            Index stage,\
            Index sfSC_sI,\
            const std::vector<Index>& aoHistIs_e, \
            Index jaI_e) \
            should be overridden!");
    }